

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

void polyscope::validateName(string *name)

{
  bool bVar1;
  long lVar2;
  char *in_RDI;
  string *in_stack_00000020;
  char *in_stack_ffffffffffffff88;
  allocator *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [32];
  char *local_8;
  
  local_8 = in_RDI;
  bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    paVar3 = &local_29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"name must not be the empty string",paVar3);
    error(in_stack_00000020);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  lVar2 = std::__cxx11::string::find(local_8,0x4ecc99);
  if (lVar2 != -1) {
    paVar3 = &local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"name must not contain \'#\' characters",paVar3);
    error(in_stack_00000020);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  return;
}

Assistant:

void validateName(const std::string& name) {
  if(name == "") polyscope::error("name must not be the empty string");
  if(name.find("#") != std::string::npos) polyscope::error("name must not contain '#' characters");
}